

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-obj.c
# Opt level: O2

void project_object_elemental
               (project_object_handler_context_t *context,wchar_t element,char *singular_verb,
               char *plural_verb)

{
  byte bVar1;
  
  bVar1 = context->obj->el_info[(uint)element].flags;
  if ((bVar1 & 1) != 0) {
    context->do_kill = true;
    if (context->obj->number == '\x01') {
      plural_verb = singular_verb;
    }
    context->note_kill = plural_verb;
    context->ignore = (_Bool)(bVar1 >> 1 & 1);
  }
  return;
}

Assistant:

static void project_object_elemental(project_object_handler_context_t *context,
									 int element, const char *singular_verb,
									 const char *plural_verb)
{
	if (context->obj->el_info[element].flags & EL_INFO_HATES) {
		context->do_kill = true;
		context->note_kill = VERB_AGREEMENT(context->obj->number,
											singular_verb, plural_verb);
		context->ignore = (context->obj->el_info[element].flags &
						   EL_INFO_IGNORE) ? true : false;
	}
}